

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void __thiscall notch::core::ActivationLayer::backpropInplace(ActivationLayer *this,Array *errors)

{
  element_type *peVar1;
  size_t sVar2;
  Activation *pAVar3;
  float *y_begin;
  float *z_begin;
  float *pfVar4;
  float *pfVar5;
  float *z_end;
  float *pfVar6;
  float extraout_XMM0_Da;
  
  peVar1 = (this->super_ABackpropLayer).shared.inputBuffer.
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar2 = peVar1->_M_size;
  pfVar6 = peVar1->_M_data;
  pfVar5 = pfVar6 + sVar2;
  if (sVar2 == 0) {
    pfVar5 = (float *)0x0;
    pfVar6 = (float *)0x0;
  }
  if (pfVar6 != pfVar5) {
    pfVar4 = (float *)(this->activationGrad)._M_size;
    if (pfVar4 != (float *)0x0) {
      pfVar4 = (this->activationGrad)._M_data;
    }
    pAVar3 = this->activationFunction;
    do {
      (*pAVar3->_vptr_Activation[2])(*pfVar6,pAVar3);
      *pfVar4 = extraout_XMM0_Da;
      pfVar6 = pfVar6 + 1;
      pfVar4 = pfVar4 + 1;
    } while (pfVar6 != pfVar5);
  }
  sVar2 = (this->activationGrad)._M_size;
  pfVar6 = (this->activationGrad)._M_data;
  pfVar5 = pfVar6 + sVar2;
  if (sVar2 == 0) {
    pfVar5 = (float *)0x0;
    pfVar6 = (float *)0x0;
  }
  y_begin = errors->_M_data;
  pfVar4 = y_begin + errors->_M_size;
  if (errors->_M_size == 0) {
    pfVar4 = (float *)0x0;
    y_begin = (float *)0x0;
  }
  sVar2 = (this->propagatedErrors)._M_size;
  z_begin = (this->propagatedErrors)._M_data;
  z_end = z_begin + sVar2;
  if (sVar2 == 0) {
    z_end = (float *)0x0;
    z_begin = (float *)0x0;
  }
  internal::emul<float*,float_const*,float*>(pfVar6,pfVar5,y_begin,pfVar4,z_begin,z_end);
  return;
}

Assistant:

virtual void backpropInplace(const Array &errors) {
        auto &inputs = *shared.inputBuffer;
        auto &activation = (*activationFunction);
        std::transform(
            std::begin(inputs), std::end(inputs),
            std::begin(activationGrad),
            [&](float y) { return activation.derivative(y); });
#ifdef NOTCH_DISABLE_OPTIMIZATIONS
        propagatedErrors = activationGrad * errors;
#else /* optimized version */
        internal::emul(std::begin(activationGrad), std::end(activationGrad),
                       std::begin(errors), std::end(errors),
                       std::begin(propagatedErrors), std::end(propagatedErrors));
#endif
    }